

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetCoordinateSprite
          (ON_Viewport *this,int size,int scrx,int scry,int *indx,double (*scr_coord) [2])

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  ON_3dPoint C;
  ON_3dVector Scr [3];
  ON_3dVector Z;
  ON_3dVector X;
  ON_3dPoint ZP;
  ON_3dPoint YP;
  ON_Xform w2s;
  ON_3dPoint local_1b8;
  ON_3dPoint local_1a0;
  ON_3dPoint local_188;
  ON_3dVector local_170;
  ON_3dVector local_158;
  ON_3dPoint local_138;
  ON_3dVector local_118;
  ON_3dVector local_100;
  ON_3dPoint local_e8;
  ON_3dPoint local_c8;
  ON_Xform local_b0;
  
  indx[0] = 0;
  indx[1] = 1;
  indx[2] = 2;
  dVar8 = (double)scrx;
  scr_coord[2][0] = dVar8;
  scr_coord[1][0] = dVar8;
  dVar9 = (double)scry;
  (*scr_coord)[0] = dVar8;
  scr_coord[2][1] = dVar9;
  scr_coord[1][1] = dVar9;
  (*scr_coord)[1] = dVar9;
  ON_Xform::ON_Xform(&local_b0);
  pdVar4 = ON_3dPoint::operator_cast_to_double_(&local_1b8);
  bVar3 = GetFrustumCenter(this,pdVar4);
  if (bVar3) {
    pdVar4 = ON_3dVector::operator_cast_to_double_(&local_100);
    pdVar5 = ON_3dVector::operator_cast_to_double_(&local_118);
    if (pdVar4 != (double *)0x0) {
      *pdVar4 = (this->m_CamX).x;
      pdVar4[1] = (this->m_CamX).y;
      pdVar4[2] = (this->m_CamX).z;
    }
    if (pdVar5 != (double *)0x0) {
      *pdVar5 = (this->m_CamZ).x;
      pdVar5[1] = (this->m_CamZ).y;
      pdVar5[2] = (this->m_CamZ).z;
    }
    if (this->m_bValidCamera == true) {
      bVar3 = GetXform(this,world_cs,screen_cs,&local_b0);
      if (!bVar3) {
        return false;
      }
      lVar6 = 0;
      do {
        lVar7 = lVar6;
        do {
          pdVar4 = ON_3dVector::operator[](&local_118,indx[lVar6]);
          dVar1 = *pdVar4;
          pdVar4 = ON_3dVector::operator[](&local_118,indx[lVar7 + 1]);
          if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
            iVar2 = indx[lVar6];
            indx[lVar6] = indx[lVar7 + 1];
            indx[lVar7 + 1] = iVar2;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 2);
        bVar3 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar3);
      ON_3dPoint::operator+(&local_138,&local_1b8,&local_100);
      ON_Xform::operator*(&local_188,&local_b0,&local_1b8);
      dVar1 = local_188.x;
      ON_Xform::operator*(&local_188,&local_b0,&local_138);
      if ((dVar1 == local_188.x) && (!NAN(dVar1) && !NAN(local_188.x))) {
        return (bool)(-(dVar1 != local_188.x) & 1);
      }
      local_e8.z = (double)size / ABS(dVar1 - local_188.x);
      local_138.y = local_1b8.y;
      local_138.z = local_1b8.z;
      local_138.x = local_1b8.x + local_e8.z;
      local_c8.x = local_1b8.x;
      local_c8.z = local_1b8.z;
      local_c8.y = local_1b8.y + local_e8.z;
      local_e8.x = local_1b8.x;
      local_e8.y = local_1b8.y;
      local_e8.z = local_e8.z + local_1b8.z;
      ON_Xform::operator*(&local_1a0,&local_b0,&local_138);
      ON_3dVector::operator=((ON_3dVector *)&local_188,&local_1a0);
      ON_Xform::operator*(&local_1a0,&local_b0,&local_c8);
      ON_3dVector::operator=(&local_170,&local_1a0);
      ON_Xform::operator*(&local_1a0,&local_b0,&local_e8);
      ON_3dVector::operator=(&local_158,&local_1a0);
      lVar6 = 8;
      pdVar4 = &local_188.y;
      do {
        *(double *)((long)scr_coord[-1] + lVar6 + 8) =
             ((ON_3dPoint *)(pdVar4 + -1))->x + (dVar8 - dVar1);
        *(double *)((long)*scr_coord + lVar6) = *pdVar4 + (dVar9 - local_188.y);
        lVar6 = lVar6 + 0x10;
        pdVar4 = pdVar4 + 3;
      } while (lVar6 != 0x38);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::GetCoordinateSprite( 
                     int size, 
                     int scrx, int scry,
                     int indx[3], // axis order by depth
                     double scr_coord[3][2] ) const
{
  // size = length of axes in pixels

  indx[0] = 0; indx[1] = 1; indx[2] = 2;
  scr_coord[0][0] = scr_coord[1][0] = scr_coord[2][0] = scrx;
  scr_coord[0][1] = scr_coord[1][1] = scr_coord[2][1] = scry;

  ON_3dPoint C, XP, YP, ZP, ScrC, ScrXP;
  ON_3dVector X, Z, Scr[3];
  ON_Xform w2s;
  if (!GetFrustumCenter( C ) )
    return false;
  if (!GetCameraFrame( nullptr, X, nullptr, Z )) 
    return false;
  if (!GetXform( ON::world_cs, ON::screen_cs, w2s )) 
    return false;

  // indx[] determines order that axes are drawn
  // sorted from back to front
  int i,j,k;
  for (i = 0; i < 2; i++) for (j = i+1; j <= 2; j++) {
    if (Z[indx[i]] > Z[indx[j]])
      {k = indx[i]; indx[i] = indx[j]; indx[j] = k;}
  }

  // determine world length that corresponds to size pixels
  XP = C+X;
  ScrC = w2s*C;
  ScrXP = w2s*XP;
  if (ScrC.x == ScrXP.x)
    return false;
  double s = size/fabs( ScrC.x - ScrXP.x );

  // transform world coord axes to screen
  XP = C;
  XP.x += s;
  YP = C;
  YP.y += s;
  ZP = C;
  ZP.z += s;
  Scr[0] = w2s*XP;
  Scr[1] = w2s*YP;
  Scr[2] = w2s*ZP;
  
  double dx = scrx - ScrC.x;
  double dy = scry - ScrC.y;
  for (i=0;i<3;i++) {
    scr_coord[i][0] = dx + Scr[i].x; 
    scr_coord[i][1] = dy + Scr[i].y;
  }

  return true;
}